

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

void __thiscall
VGMPlayer::RefreshMuting(VGMPlayer *this,CHIP_DEVICE *chipDev,PLR_MUTE_OPTS *muteOpts)

{
  DEV_INFO *devInf;
  CHIP_DEVICE *pCStack_28;
  UINT8 linkCntr;
  VGM_BASEDEV *clDev;
  PLR_MUTE_OPTS *muteOpts_local;
  CHIP_DEVICE *chipDev_local;
  VGMPlayer *this_local;
  
  devInf._7_1_ = 0;
  for (pCStack_28 = chipDev; pCStack_28 != (CHIP_DEVICE *)0x0 && devInf._7_1_ < 2;
      pCStack_28 = (CHIP_DEVICE *)(pCStack_28->base).linkDev) {
    if (((pCStack_28->base).defInf.dataPtr != (DEV_DATA *)0x0) &&
       (((pCStack_28->base).defInf.devDef)->SetMuteMask != (DEVFUNC_OPTMASK)0x0)) {
      (*((pCStack_28->base).defInf.devDef)->SetMuteMask)
                ((pCStack_28->base).defInf.dataPtr,muteOpts->chnMute[devInf._7_1_]);
    }
    devInf._7_1_ = devInf._7_1_ + 1;
  }
  return;
}

Assistant:

void VGMPlayer::RefreshMuting(VGMPlayer::CHIP_DEVICE& chipDev, const PLR_MUTE_OPTS& muteOpts)
{
	VGM_BASEDEV* clDev;
	UINT8 linkCntr = 0;
	
	for (clDev = &chipDev.base; clDev != NULL && linkCntr < 2; clDev = clDev->linkDev, linkCntr ++)
	{
		DEV_INFO* devInf = &clDev->defInf;
		if (devInf->dataPtr != NULL && devInf->devDef->SetMuteMask != NULL)
			devInf->devDef->SetMuteMask(devInf->dataPtr, muteOpts.chnMute[linkCntr]);
	}
	
	return;
}